

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate.cpp
# Opt level: O2

uint __thiscall
Validate::CheckIDDoesNotExceedMaxLimit(Validate *this,char *idName,unsigned_long_long initialID)

{
  int iVar1;
  uint uVar2;
  uint extraout_EAX;
  char *pcVar3;
  size_t sVar4;
  
  if (0xffffffff00000000 < initialID - 0x100000000) {
    return (uint)initialID;
  }
  fprintf(_stderr,
          "ERROR: %s ID %lld on line %d does not lie within permitted range [%d, %u]. Please reassign %s IDs to lie within this range.\n"
          ,idName,initialID,(ulong)(uint)this->lineno_,(ulong)(uint)this->MIN_ID_,0xffffffff,idName)
  ;
  PrintErrorMessage(this);
  pcVar3 = fgets(this->line_,0x1000,_stdin);
  if (pcVar3 != (char *)0x0) {
    iVar1 = ValidateDamageBin::ScanDeprecatedFormat((ValidateDamageBin *)this);
    if (iVar1 == 5) {
      sVar4 = fwrite("WARNING: Deprecated format: interval_type column no longer required.\n",0x45,1
                     ,_stderr);
      uVar2 = (uint)sVar4;
      ((ValidateDamageBin *)this)->newFormat_ = false;
      (((ValidateDamageBin *)this)->super_Validate).warnings_ = true;
    }
    else {
      iVar1 = ValidateDamageBin::ScanNewFormat((ValidateDamageBin *)this);
      if (iVar1 != 4) {
        fprintf(_stderr,"ERROR: Invalid data in line %d:\n%s\n",
                (ulong)(uint)(((ValidateDamageBin *)this)->super_Validate).lineno_,this);
        PrintErrorMessage(this);
        goto LAB_001014d4;
      }
      (((ValidateDamageBin *)this)->dbd_).interval_type = 0;
      ((ValidateDamageBin *)this)->newFormat_ = true;
      uVar2 = 4;
    }
    return uVar2;
  }
LAB_001014d4:
  fwrite("ERROR: Empty file\n",0x12,1,_stderr);
  PrintErrorMessage(this);
  return extraout_EAX;
}

Assistant:

unsigned int Validate::CheckIDDoesNotExceedMaxLimit(char *idName,
	unsigned long long initialID) {
/* Check ID does not exceed maximum value for unsigned integers. */

  // No need to check for negative numbers as ID is of unsigned long long data
  // type and therefore negative numbers should exceed the maximum value for an
  // unsigned integer (i.e. UINT_MAX).
  if (initialID == 0 || initialID > UINT_MAX) {

    fprintf(stderr, "ERROR: %s ID %lld on line %d does not lie within"
		    " permitted range [%d, %u]. Please reassign %s IDs to lie"
		    " within this range.\n",
		    idName, (long long)initialID, lineno_, MIN_ID_, UINT_MAX,
		    idName);
    PrintErrorMessage();

  }

  return (unsigned int)initialID;

}